

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_3699c::phase_1_commitment
          (limbo_instance_t *instance,limbo_salt_t *salt,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *witness_out,
          vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          *commitments,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *witness_deltas,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *mult_deltas,
          vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
          *output_broadcasts)

{
  const_reference pvVar1;
  const_reference pvVar2;
  reference this;
  hash_context *ctx_00;
  uchar *buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  array<unsigned_char,_32UL> *in_RDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *in_R8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_R9;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_00000008;
  size_t party;
  size_t repetition;
  hash_context ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment;
  uint8_t *in_stack_fffffffffffffe40;
  hash_context *in_stack_fffffffffffffe48;
  allocator_type *in_stack_fffffffffffffe58;
  uchar *in_stack_fffffffffffffe60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe68;
  undefined8 local_150;
  undefined8 local_148;
  
  hash_init_prefix(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40,'\0');
  std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x116e70);
  std::array<unsigned_char,_32UL>::size(in_RDX);
  hash_update(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,0x116e97);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116ea4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RCX);
  hash_update(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,0x116ecb);
  for (local_148 = 0; local_148 < *(uint *)(in_RSI + 0x18); local_148 = local_148 + 1) {
    for (local_150 = 0; local_150 < *(uint *)(in_RSI + 0x1c); local_150 = local_150 + 1) {
      pvVar1 = std::
               vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::operator[](in_R8,local_148);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](pvVar1,local_150);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116f32);
      pvVar1 = std::
               vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::operator[](in_R8,local_148);
      pvVar2 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](pvVar1,local_150);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
      hash_update(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,0x116f73);
    }
    std::
    vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
    ::operator[]((vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
                  *)mult_deltas,local_148);
    in_stack_fffffffffffffe58 =
         (allocator_type *)
         std::
         vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
         data((vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
               *)0x116f9c);
    this = std::
           vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
           ::operator[]((vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
                         *)mult_deltas,local_148);
    std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>::
    size(this);
    hash_update(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,0x116fd4);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[](in_R9,local_148);
    in_stack_fffffffffffffe60 =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116fee);
    pvVar2 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](in_R9,local_148);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
    hash_update(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,0x117022);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[](in_stack_00000008,local_148);
    in_stack_fffffffffffffe68 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x117038);
    pvVar2 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](in_stack_00000008,local_148);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
    hash_update(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,0x117068);
  }
  hash_final((hash_context *)0x117088);
  ctx_00 = (hash_context *)(ulong)*(uint *)(in_RSI + 0x10);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1170ac);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe68,(size_type)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1170cc);
  buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1170d6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  hash_squeeze(ctx_00,buffer,0x1170f8);
  return in_RDI;
}

Assistant:

std::vector<uint8_t> phase_1_commitment(
    const limbo_instance_t &instance, const limbo_salt_t &salt,
    const std::vector<uint8_t> &witness_out,
    const std::vector<std::vector<std::vector<uint8_t>>> &commitments,
    const std::vector<std::vector<uint8_t>> &witness_deltas,
    const std::vector<std::vector<uint8_t>> &mult_deltas,
    std::vector<std::vector<std::array<uint64_t, PARTY64>>>
        &output_broadcasts) {

  hash_context ctx;
  hash_init_prefix(&ctx, instance.digest_size, HASH_PREFIX_1);
  hash_update(&ctx, salt.data(), salt.size());
  hash_update(&ctx, witness_out.data(), witness_out.size());

  for (size_t repetition = 0; repetition < instance.num_rounds; repetition++) {
    for (size_t party = 0; party < instance.num_MPC_parties; party++) {
      hash_update(&ctx, commitments[repetition][party].data(),
                  commitments[repetition][party].size());
    }
    // dirty hack, need to check
    hash_update(&ctx, (uint8_t *)output_broadcasts[repetition].data(),
                PARTY64 * output_broadcasts[repetition].size() * 8);
    hash_update(&ctx, witness_deltas[repetition].data(),
                witness_deltas[repetition].size());
    hash_update(&ctx, mult_deltas[repetition].data(),
                mult_deltas[repetition].size());
  }
  hash_final(&ctx);

  std::vector<uint8_t> commitment(instance.digest_size);
  hash_squeeze(&ctx, commitment.data(), commitment.size());
  return commitment;
}